

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O0

CImg<unsigned_char> * __thiscall
cimg_library::CImg<unsigned_char>::load_graphicsmagick_external
          (CImg<unsigned_char> *this,char *filename)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uchar *puVar5;
  CImgArgumentException *this_00;
  char *pcVar6;
  char *pcVar7;
  FILE *pFVar8;
  CImg<char> *pCVar9;
  ulong uVar10;
  char *pcVar11;
  uint *puVar12;
  char *pcVar13;
  cimg *this_01;
  CImgIOException *this_02;
  CImg<char> local_e8;
  undefined4 local_c8;
  uint local_c4;
  uint omode;
  undefined1 local_a0 [8];
  CImg<char> s_filename;
  FILE *file;
  CImg<char> filename_tmp;
  CImg<char> command;
  char *filename_local;
  CImg<unsigned_char> *this_local;
  
  if (filename == (char *)0x0) {
    this_00 = (CImgArgumentException *)__cxa_allocate_exception(0x10);
    uVar1 = this->_width;
    uVar2 = this->_height;
    uVar3 = this->_depth;
    uVar4 = this->_spectrum;
    puVar5 = this->_data;
    pcVar6 = "non-";
    if ((this->_is_shared & 1U) != 0) {
      pcVar6 = "";
    }
    pcVar7 = pixel_type();
    CImgArgumentException::CImgArgumentException
              (this_00,
               "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::load_graphicsmagick_external(): Specified filename is (null)."
               ,(ulong)uVar1,(ulong)uVar2,(ulong)uVar3,(ulong)uVar4,puVar5,pcVar6,pcVar7);
    __cxa_throw(this_00,&CImgArgumentException::typeinfo,
                CImgArgumentException::~CImgArgumentException);
  }
  pFVar8 = cimg::fopen(filename,"rb");
  fclose(pFVar8);
  CImg<char>::CImg((CImg<char> *)&filename_tmp._data,0x400,1,1,1);
  CImg<char>::CImg((CImg<char> *)&file,0x100,1,1,1);
  s_filename._data = (char *)0x0;
  CImg<char>::string((CImg<char> *)&stack0xffffffffffffff40,filename,true,false);
  pCVar9 = CImg<char>::_system_strescape((CImg<char> *)&stack0xffffffffffffff40);
  CImg<char>::CImg((CImg<char> *)local_a0,pCVar9);
  CImg<char>::~CImg((CImg<char> *)&stack0xffffffffffffff40);
  pcVar6 = cimg_library::CImg::operator_cast_to_char_((CImg *)&filename_tmp._data);
  uVar10 = (ulong)(uint)filename_tmp._data;
  pcVar7 = cimg::graphicsmagick_path((char *)0x0,false);
  pcVar11 = CImg<char>::data((CImg<char> *)local_a0);
  snprintf(pcVar6,uVar10,"%s convert \"%s\" pnm:-",pcVar7,pcVar11);
  pcVar6 = cimg_library::CImg::operator_cast_to_char_((CImg *)&filename_tmp._data);
  s_filename._data = (char *)popen(pcVar6,"r");
  if ((FILE *)s_filename._data == (FILE *)0x0) {
    s_filename._data = (char *)0x0;
    do {
      pcVar6 = cimg_library::CImg::operator_cast_to_char_((CImg *)&file);
      uVar10 = (ulong)(uint)file;
      pcVar7 = cimg::temporary_path((char *)0x0,false);
      pcVar11 = cimg::filenamerand();
      snprintf(pcVar6,uVar10,"%s%c%s.pnm",pcVar7,0x2f,pcVar11);
      pcVar6 = cimg_library::CImg::operator_cast_to_char_((CImg *)&file);
      s_filename._data = (char *)fopen(pcVar6,"rb");
      if ((FILE *)s_filename._data != (FILE *)0x0) {
        cimg::fclose((FILE *)s_filename._data);
      }
    } while (s_filename._data != (char *)0x0);
    pcVar6 = cimg_library::CImg::operator_cast_to_char_((CImg *)&filename_tmp._data);
    pcVar7 = cimg::graphicsmagick_path((char *)0x0,false);
    pcVar11 = CImg<char>::data((CImg<char> *)local_a0);
    pcVar13 = cimg_library::CImg::operator_cast_to_char_((CImg *)&file);
    CImg<char>::string(&local_e8,pcVar13,true,false);
    pCVar9 = CImg<char>::_system_strescape(&local_e8);
    pcVar13 = CImg<char>::data(pCVar9);
    snprintf(pcVar6,(ulong)(uint)filename_tmp._data,"%s convert \"%s\" \"%s\"",pcVar7,pcVar11,
             pcVar13);
    CImg<char>::~CImg(&local_e8);
    this_01 = (cimg *)cimg_library::CImg::operator_cast_to_char_((CImg *)&filename_tmp._data);
    pcVar6 = cimg::graphicsmagick_path((char *)0x0,false);
    cimg::system(this_01,pcVar6);
    pcVar6 = cimg_library::CImg::operator_cast_to_char_((CImg *)&file);
    s_filename._data = (char *)fopen(pcVar6,"rb");
    if ((FILE *)s_filename._data == (FILE *)0x0) {
      pFVar8 = cimg::fopen(filename,"r");
      cimg::fclose(pFVar8);
      this_02 = (CImgIOException *)__cxa_allocate_exception(0x10);
      uVar1 = this->_width;
      uVar2 = this->_height;
      uVar3 = this->_depth;
      uVar4 = this->_spectrum;
      puVar5 = this->_data;
      pcVar6 = "non-";
      if ((this->_is_shared & 1U) != 0) {
        pcVar6 = "";
      }
      pcVar7 = pixel_type();
      CImgIOException::CImgIOException
                (this_02,
                 "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::load_graphicsmagick_external(): Failed to load file \'%s\' with external command \'gm\'."
                 ,(ulong)uVar1,(ulong)uVar2,(ulong)uVar3,(ulong)uVar4,puVar5,pcVar6,pcVar7,filename)
      ;
      __cxa_throw(this_02,&CImgIOException::typeinfo,CImgIOException::~CImgIOException);
    }
    cimg::fclose((FILE *)s_filename._data);
    pcVar6 = cimg_library::CImg::operator_cast_to_char_((CImg *)&file);
    load_pnm(this,pcVar6);
    pcVar6 = cimg_library::CImg::operator_cast_to_char_((CImg *)&file);
    remove(pcVar6);
  }
  else {
    puVar12 = cimg::exception_mode();
    local_c4 = *puVar12;
    cimg::exception_mode(0);
    load_pnm(this,(FILE *)s_filename._data);
    pclose((FILE *)s_filename._data);
  }
  local_c8 = 1;
  CImg<char>::~CImg((CImg<char> *)local_a0);
  CImg<char>::~CImg((CImg<char> *)&file);
  CImg<char>::~CImg((CImg<char> *)&filename_tmp._data);
  return this;
}

Assistant:

CImg<T>& load_graphicsmagick_external(const char *const filename) {
      if (!filename)
        throw CImgArgumentException(_cimg_instance
                                    "load_graphicsmagick_external(): Specified filename is (null).",
                                    cimg_instance);
      std::fclose(cimg::fopen(filename,"rb"));            // Check if file exists.
      CImg<charT> command(1024), filename_tmp(256);
      std::FILE *file = 0;
      const CImg<charT> s_filename = CImg<charT>::string(filename)._system_strescape();
#if cimg_OS==1
      cimg_snprintf(command,command._width,"%s convert \"%s\" pnm:-",
                    cimg::graphicsmagick_path(),s_filename.data());
      file = popen(command,"r");
      if (file) {
        const unsigned int omode = cimg::exception_mode();
        cimg::exception_mode(0);
        try { load_pnm(file); } catch (...) {
          pclose(file);
          cimg::exception_mode(omode);
          throw CImgIOException(_cimg_instance
                                "load_graphicsmagick_external(): Failed to load file '%s' with external command 'gm'.",
                                cimg_instance,
                                filename);
        }
        pclose(file);
        return *this;
      }
#endif
      do {
        cimg_snprintf(filename_tmp,filename_tmp._width,"%s%c%s.pnm",
                      cimg::temporary_path(),cimg_file_separator,cimg::filenamerand());
        if ((file=std::fopen(filename_tmp,"rb"))!=0) cimg::fclose(file);
      } while (file);
      cimg_snprintf(command,command._width,"%s convert \"%s\" \"%s\"",
                    cimg::graphicsmagick_path(),s_filename.data(),
                    CImg<charT>::string(filename_tmp)._system_strescape().data());
      cimg::system(command,cimg::graphicsmagick_path());
      if (!(file = std::fopen(filename_tmp,"rb"))) {
        cimg::fclose(cimg::fopen(filename,"r"));
        throw CImgIOException(_cimg_instance
                              "load_graphicsmagick_external(): Failed to load file '%s' with external command 'gm'.",
                              cimg_instance,
                              filename);

      } else cimg::fclose(file);
      load_pnm(filename_tmp);
      std::remove(filename_tmp);
      return *this;
    }